

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

IvVec2 * deqp::egl::ivVec2(IvVec2 *__return_storage_ptr__,IVec2 *vec)

{
  Interval x_;
  Interval y_;
  int iVar1;
  Interval local_48;
  Interval local_30;
  IVec2 *local_18;
  IVec2 *vec_local;
  
  local_18 = vec;
  vec_local = (IVec2 *)__return_storage_ptr__;
  iVar1 = tcu::Vector<int,_2>::x(vec);
  tcu::Interval::Interval(&local_30,(double)iVar1);
  iVar1 = tcu::Vector<int,_2>::y(local_18);
  tcu::Interval::Interval(&local_48,(double)iVar1);
  x_.m_lo = local_30.m_lo;
  x_.m_hasNaN = local_30.m_hasNaN;
  x_._1_7_ = local_30._1_7_;
  x_.m_hi = local_30.m_hi;
  y_.m_lo = local_48.m_lo;
  y_.m_hasNaN = local_48.m_hasNaN;
  y_._1_7_ = local_48._1_7_;
  y_.m_hi = local_48.m_hi;
  tcu::Vector<tcu::Interval,_2>::Vector(__return_storage_ptr__,x_,y_);
  return __return_storage_ptr__;
}

Assistant:

IvVec2 ivVec2 (const IVec2& vec)
{
	return IvVec2(double(vec.x()), double(vec.y()));
}